

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  int iVar1;
  allocator<char> local_81;
  string local_80;
  ScopedElement local_60;
  string local_50;
  ScopedElement e;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"OverallResult",(allocator<char> *)&local_50);
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"success",(allocator<char> *)&local_50);
  XmlWriter::writeAttribute(e.m_writer,&local_80,(testCaseStats->totals).assertions.failed == 0);
  std::__cxx11::string::~string((string *)&local_80);
  iVar1 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"durationInSeconds",(allocator<char> *)&local_60);
    local_50._M_dataplus._M_p = (pointer)Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::writeAttribute<double>(e.m_writer,&local_80,(double *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"StdOut",&local_81);
    XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_00,(XmlFormatting)&local_80);
    trim(&local_50,&testCaseStats->stdOut);
    XmlWriter::writeText(local_60.m_writer,&local_50,Newline);
    std::__cxx11::string::~string((string *)&local_50);
    XmlWriter::ScopedElement::~ScopedElement(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"StdErr",&local_81);
    XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_00,(XmlFormatting)&local_80);
    trim(&local_50,&testCaseStats->stdErr);
    XmlWriter::writeText(local_60.m_writer,&local_50,Newline);
    std::__cxx11::string::~string((string *)&local_50);
    XmlWriter::ScopedElement::~ScopedElement(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  return;
}

Assistant:

void XmlReporter::testCaseEnded(TestCaseStats const &testCaseStats) {
        StreamingReporterBase::testCaseEnded(testCaseStats);
        XmlWriter::ScopedElement e = m_xml.scopedElement("OverallResult");
        e.writeAttribute("success", testCaseStats.totals.assertions.allOk());

        if (m_config->showDurations() == ShowDurations::Always)
            e.writeAttribute("durationInSeconds", m_testCaseTimer.getElapsedSeconds());

        if (!testCaseStats.stdOut.empty())
            m_xml.scopedElement("StdOut").writeText(trim(testCaseStats.stdOut), XmlFormatting::Newline);
        if (!testCaseStats.stdErr.empty())
            m_xml.scopedElement("StdErr").writeText(trim(testCaseStats.stdErr), XmlFormatting::Newline);

        m_xml.endElement();
    }